

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleGetMultisamplefvTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::MultisampleTextureGetMultisamplefvIndexEqualGLSamplesRejectedTest::iterate
          (MultisampleTextureGetMultisamplefvIndexEqualGLSamplesRejectedTest *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestError *this_00;
  undefined1 local_24 [8];
  GLfloat val [2];
  GLint gl_samples_value;
  Functions *gl;
  MultisampleTextureGetMultisamplefvIndexEqualGLSamplesRejectedTest *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  register0x00000000 = CONCAT44(extraout_var,iVar1);
  val[0] = 0.0;
  (**(code **)(register0x00000000 + 0x868))(0x80a9,val);
  err = (**(code **)(stack0xffffffffffffffe8 + 0x800))();
  glu::checkError(err,"Failed to retrieve GL_SAMPLES value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGetMultisamplefvTests.cpp"
                  ,0x44);
  (**(code **)(stack0xffffffffffffffe8 + 0x8e8))(0x8e50,val[0],local_24);
  iVar1 = (**(code **)(stack0xffffffffffffffe8 + 0x800))();
  if (iVar1 != 0x501) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid error code reported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGetMultisamplefvTests.cpp"
               ,0x4d);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureGetMultisamplefvIndexEqualGLSamplesRejectedTest::iterate()
{
	const glw::Functions& gl			   = m_context.getRenderContext().getFunctions();
	glw::GLint			  gl_samples_value = 0;

	/* Get GL_SAMPLES value */
	gl.getIntegerv(GL_SAMPLES, &gl_samples_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to retrieve GL_SAMPLES value");

	/* Issue call with valid parameters, but invalid index equal to GL_SAMPLES value */
	glw::GLfloat val[2];
	gl.getMultisamplefv(GL_SAMPLE_POSITION, gl_samples_value, val);

	/* Check if the expected error code was reported */
	if (gl.getError() != GL_INVALID_VALUE)
	{
		TCU_FAIL("Invalid error code reported");
	}

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}